

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O1

void __thiscall Memory::PagePool::~PagePool(PagePool *this)

{
  undefined4 *puVar1;
  PagePoolFreePage *address;
  code *pcVar2;
  bool bVar3;
  PagePoolFreePage *page;
  undefined8 *in_FS_OFFSET;
  
  if (this->freePageList != (PagePoolFreePage *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                       ,0x5c,"(freePageList == nullptr)","freePageList == nullptr");
    if (!bVar3) {
LAB_0027752d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->reservedPageList != (PagePoolFreePage *)0x0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    while (address = this->reservedPageList, address != (PagePoolFreePage *)0x0) {
      if ((address->super_PagePoolPage).isReserved == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,99,"(page->IsReserved())","page->IsReserved()");
        if (!bVar3) goto LAB_0027752d;
        *puVar1 = 0;
      }
      this->reservedPageList = this->reservedPageList->nextFreePage;
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::ReleasePages((address->super_PagePoolPage).pageAllocator,address,1,
                     (address->super_PagePoolPage).pageSegment);
    }
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::~PageAllocatorBase(&this->pageAllocator);
  return;
}

Assistant:

~PagePool()
    {
        Assert(freePageList == nullptr);

        if (reservedPageList != nullptr)
        {
            while (reservedPageList != nullptr)
            {
                PagePoolFreePage * page = reservedPageList;
                Assert(page->IsReserved());
                reservedPageList = reservedPageList->nextFreePage;
                page->Free();
            }
        }
    }